

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HasImplibGNUtoMS(cmGeneratorTarget *this)

{
  bool bVar1;
  allocator local_31;
  string local_30;
  
  bVar1 = HasImportLibrary(this);
  if (bVar1) {
    std::__cxx11::string::string((string *)&local_30,"GNUtoMS",&local_31);
    bVar1 = GetPropertyAsBool(this,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasImplibGNUtoMS() const
{
  return this->HasImportLibrary()
      && this->GetPropertyAsBool("GNUtoMS");
}